

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.cpp
# Opt level: O3

IndentMarker * __thiscall YAML::Scanner::PushIndentTo(Scanner *this,int column,INDENT_TYPE type)

{
  iterator *piVar1;
  int iVar2;
  TYPE type_00;
  IndentMarker *pIVar3;
  _Elt_pointer ppIVar4;
  Token *pTVar5;
  Scanner *this_00;
  _Head_base<0UL,_YAML::Scanner::IndentMarker_*,_false> local_38;
  _Head_base<0UL,_YAML::Scanner::IndentMarker_*,_false> local_30;
  
  if ((this->m_flows).c.
      super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>.
      _M_impl.super__Deque_impl_data._M_finish._M_cur ==
      (this->m_flows).c.
      super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>.
      _M_impl.super__Deque_impl_data._M_start._M_cur) {
    this_00 = (Scanner *)0x18;
    pIVar3 = (IndentMarker *)operator_new(0x18);
    pIVar3->column = column;
    pIVar3->type = type;
    pIVar3->status = VALID;
    pIVar3->pStartToken = (Token *)0x0;
    ppIVar4 = (this->m_indents).c.
              super__Deque_base<YAML::Scanner::IndentMarker_*,_std::allocator<YAML::Scanner::IndentMarker_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppIVar4 ==
        (this->m_indents).c.
        super__Deque_base<YAML::Scanner::IndentMarker_*,_std::allocator<YAML::Scanner::IndentMarker_*>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      ppIVar4 = (this->m_indents).c.
                super__Deque_base<YAML::Scanner::IndentMarker_*,_std::allocator<YAML::Scanner::IndentMarker_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    iVar2 = ppIVar4[-1]->column;
    local_38._M_head_impl = pIVar3;
    if ((column < iVar2) || ((iVar2 == column && ((type != SEQ || (ppIVar4[-1]->type != MAP)))))) {
      pIVar3 = (IndentMarker *)0x0;
    }
    else {
      type_00 = GetStartTokenFor(this_00,type);
      pTVar5 = PushToken(this,type_00);
      pIVar3->pStartToken = pTVar5;
      ppIVar4 = (this->m_indents).c.
                super__Deque_base<YAML::Scanner::IndentMarker_*,_std::allocator<YAML::Scanner::IndentMarker_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      local_30._M_head_impl = pIVar3;
      if (ppIVar4 ==
          (this->m_indents).c.
          super__Deque_base<YAML::Scanner::IndentMarker_*,_std::allocator<YAML::Scanner::IndentMarker_*>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<YAML::Scanner::IndentMarker*,std::allocator<YAML::Scanner::IndentMarker*>>::
        _M_push_back_aux<YAML::Scanner::IndentMarker*>
                  ((deque<YAML::Scanner::IndentMarker*,std::allocator<YAML::Scanner::IndentMarker*>>
                    *)&this->m_indents,&local_30._M_head_impl);
      }
      else {
        *ppIVar4 = pIVar3;
        piVar1 = &(this->m_indents).c.
                  super__Deque_base<YAML::Scanner::IndentMarker_*,_std::allocator<YAML::Scanner::IndentMarker_*>_>
                  ._M_impl.super__Deque_impl_data._M_finish;
        piVar1->_M_cur = piVar1->_M_cur + 1;
      }
      std::
      vector<std::unique_ptr<YAML::Scanner::IndentMarker,std::default_delete<YAML::Scanner::IndentMarker>>,std::allocator<std::unique_ptr<YAML::Scanner::IndentMarker,std::default_delete<YAML::Scanner::IndentMarker>>>>
      ::
      emplace_back<std::unique_ptr<YAML::Scanner::IndentMarker,std::default_delete<YAML::Scanner::IndentMarker>>>
                ((vector<std::unique_ptr<YAML::Scanner::IndentMarker,std::default_delete<YAML::Scanner::IndentMarker>>,std::allocator<std::unique_ptr<YAML::Scanner::IndentMarker,std::default_delete<YAML::Scanner::IndentMarker>>>>
                  *)&this->m_indentRefs,
                 (unique_ptr<YAML::Scanner::IndentMarker,_std::default_delete<YAML::Scanner::IndentMarker>_>
                  *)&local_38);
      pIVar3 = (this->m_indentRefs).m_data.
               super__Vector_base<std::unique_ptr<YAML::Scanner::IndentMarker,_std::default_delete<YAML::Scanner::IndentMarker>_>,_std::allocator<std::unique_ptr<YAML::Scanner::IndentMarker,_std::default_delete<YAML::Scanner::IndentMarker>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
               super___uniq_ptr_impl<YAML::Scanner::IndentMarker,_std::default_delete<YAML::Scanner::IndentMarker>_>
               ._M_t.
               super__Tuple_impl<0UL,_YAML::Scanner::IndentMarker_*,_std::default_delete<YAML::Scanner::IndentMarker>_>
               .super__Head_base<0UL,_YAML::Scanner::IndentMarker_*,_false>._M_head_impl;
      if (local_38._M_head_impl == (IndentMarker *)0x0) {
        return pIVar3;
      }
    }
    operator_delete(local_38._M_head_impl);
  }
  else {
    pIVar3 = (IndentMarker *)0x0;
  }
  return pIVar3;
}

Assistant:

Token* Scanner::PushToken(Token::TYPE type) {
  m_tokens.push(Token(type, INPUT.mark()));
  return &m_tokens.back();
}